

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmTargetTraceDependencies::CheckCustomCommand(cmTargetTraceDependencies *this,cmCustomCommand *cc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *name;
  cmLocalGenerator *lg;
  pointer this_00;
  cmListFileBacktrace *backtrace;
  cmCustomCommandLines *pcVar2;
  cmGeneratorTarget *pcVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pbVar5;
  pointer pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_c8;
  cmCustomCommand *local_a8;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  targets;
  cmGeneratorExpression ge;
  string local_50;
  
  backtrace = cmCustomCommand::GetBacktrace(cc);
  cmGeneratorExpression::cmGeneratorExpression(&ge,backtrace);
  targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &targets._M_t._M_impl.super__Rb_tree_header._M_header;
  targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8 = cc;
  targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar2 = cmCustomCommand::GetCommandLines(cc);
  paVar1 = &local_c8.field_2;
  for (pcVar6 = (pcVar2->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pcVar2 = cmCustomCommand::GetCommandLines(local_a8),
      pcVar6 != (pcVar2->super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>).
                super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                _M_impl.super__Vector_impl_data._M_finish; pcVar6 = pcVar6 + 1) {
    name = (pcVar6->
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,name);
    if ((pcVar3 != (cmGeneratorTarget *)0x0) && (pcVar3->Target->TargetTypeValue == EXECUTABLE)) {
      cmTarget::AddUtility(this->GeneratorTarget->Target,name,(cmMakefile *)0x0);
    }
    for (pbVar5 = (pcVar6->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != (pcVar6->
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      cmGeneratorExpression::Parse((cmGeneratorExpression *)&emitted,(string *)&ge);
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)emitted._M_t._M_impl._0_8_;
      emitted._M_t._M_impl._0_8_ = 0;
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&emitted);
      this_00 = configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lg = this->GeneratorTarget->LocalGenerator;
      emitted._M_t._M_impl._0_8_ = &emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::__cxx11::string::_M_construct<char_const*>((string *)&emitted,"");
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      cmCompiledGeneratorExpression::Evaluate
                ((cmCompiledGeneratorExpression *)this_00,lg,(string *)&emitted,true,
                 (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      if ((_Base_ptr *)emitted._M_t._M_impl._0_8_ !=
          &emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)emitted._M_t._M_impl._0_8_,
                        (ulong)((long)&(emitted._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      std::
      _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
      ::_Rb_tree((_Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                  *)&emitted,
                 (_Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                  *)(configs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3));
      std::
      _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<cmGeneratorTarget*>>
                ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                  *)&targets,
                 (_Rb_tree_const_iterator<cmGeneratorTarget_*>)
                 emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<cmGeneratorTarget_*>)
                 &emitted._M_t._M_impl.super__Rb_tree_header);
      std::
      _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
      ::~_Rb_tree((_Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                   *)&emitted);
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&configs);
    }
  }
  for (p_Var4 = targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &targets._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    cmTarget::AddUtility
              (this->GeneratorTarget->Target,(string *)(**(long **)(p_Var4 + 1) + 0x110),
               (cmMakefile *)0x0);
  }
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  cmMakefile::GetConfigurations(&local_50,this->Makefile,&configs,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&configs,
               &local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
  }
  if (configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      FollowCommandDepends(this,local_a8,pbVar5,&emitted);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != configs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&emitted._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configs);
  std::
  _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  ::~_Rb_tree(&targets._M_t);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return;
}

Assistant:

void cmTargetTraceDependencies::CheckCustomCommand(cmCustomCommand const& cc)
{
  // Transform command names that reference targets built in this
  // project to corresponding target-level dependencies.
  cmGeneratorExpression ge(cc.GetBacktrace());

  // Add target-level dependencies referenced by generator expressions.
  std::set<cmGeneratorTarget*> targets;

  for (cmCustomCommandLines::const_iterator cit = cc.GetCommandLines().begin();
       cit != cc.GetCommandLines().end(); ++cit) {
    std::string const& command = *cit->begin();
    // Check for a target with this name.
    if (cmGeneratorTarget* t =
          this->LocalGenerator->FindGeneratorTargetToUse(command)) {
      if (t->GetType() == cmStateEnums::EXECUTABLE) {
        // The command refers to an executable target built in
        // this project.  Add the target-level dependency to make
        // sure the executable is up to date before this custom
        // command possibly runs.
        this->GeneratorTarget->Target->AddUtility(command);
      }
    }

    // Check for target references in generator expressions.
    for (cmCustomCommandLine::const_iterator cli = cit->begin();
         cli != cit->end(); ++cli) {
      const CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*cli);
      cge->Evaluate(this->GeneratorTarget->GetLocalGenerator(), "", true);
      std::set<cmGeneratorTarget*> geTargets = cge->GetTargets();
      targets.insert(geTargets.begin(), geTargets.end());
    }
  }

  for (std::set<cmGeneratorTarget*>::iterator ti = targets.begin();
       ti != targets.end(); ++ti) {
    this->GeneratorTarget->Target->AddUtility((*ti)->GetName());
  }

  // Queue the custom command dependencies.
  std::vector<std::string> configs;
  std::set<std::string> emitted;
  this->Makefile->GetConfigurations(configs);
  if (configs.empty()) {
    configs.push_back("");
  }
  for (std::vector<std::string>::const_iterator ci = configs.begin();
       ci != configs.end(); ++ci) {
    this->FollowCommandDepends(cc, *ci, emitted);
  }
}